

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  undefined8 *puVar1;
  long lVar2;
  string *psVar3;
  char cVar4;
  IMutableContext *pIVar5;
  undefined8 *puVar6;
  long *plVar7;
  char *pcVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  pointer pcVar12;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  string *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  undefined1 local_b0 [8];
  string s;
  ulong local_80;
  long lStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  string subs;
  
  local_b0 = (undefined1  [8])&s._M_string_length;
  pcVar12 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar12,pcVar12 + value->_M_string_length);
  pIVar5 = getCurrentMutableContext();
  (*(pIVar5->super_IContext)._vptr_IContext[6])(local_50);
  cVar4 = (**(code **)(*(size_type *)local_50 + 0x58))();
  local_d8 = __return_storage_ptr__;
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_50 + 0x18))();
  }
  if ((cVar4 != '\0') && (s._M_dataplus._M_p != (pointer)0x0)) {
    psVar10 = &subs._M_string_length;
    pcVar12 = (pointer)0x0;
    do {
      subs._M_dataplus._M_p = (pointer)0x0;
      subs._M_string_length._0_1_ = 0;
      local_50 = (undefined1  [8])psVar10;
      if (*(char *)((long)local_b0 + (long)pcVar12) == '\t') {
        pcVar8 = "\\t";
LAB_00133fb5:
        std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar8);
        if (subs._M_dataplus._M_p != (pointer)0x0) {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)local_b0);
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_f8,(ulong)local_50);
          puVar9 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar9) {
            local_80 = *puVar9;
            lStack_78 = plVar7[3];
            s.field_2._8_8_ = &local_80;
          }
          else {
            local_80 = *puVar9;
            s.field_2._8_8_ = (ulong *)*plVar7;
          }
          lVar2 = plVar7[1];
          *plVar7 = (long)puVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          pcVar12 = pcVar12 + 1;
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_b0);
          uVar11 = 0xf;
          if ((ulong *)s.field_2._8_8_ != &local_80) {
            uVar11 = local_80;
          }
          if (uVar11 < (ulong)(local_c8 + lVar2)) {
            uVar11 = 0xf;
            if (local_d0 != local_c0) {
              uVar11 = local_c0[0];
            }
            if (uVar11 < (ulong)(local_c8 + lVar2)) goto LAB_001340a6;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,s.field_2._8_8_);
          }
          else {
LAB_001340a6:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append(s.field_2._M_local_buf + 8,(ulong)local_d0);
          }
          local_70 = &local_60;
          puVar1 = puVar6 + 2;
          if ((undefined8 *)*puVar6 == puVar1) {
            local_60 = *puVar1;
            uStack_58 = puVar6[3];
          }
          else {
            local_60 = *puVar1;
            local_70 = (undefined8 *)*puVar6;
          }
          local_68 = puVar6[1];
          *puVar6 = puVar1;
          puVar6[1] = 0;
          *(undefined1 *)puVar1 = 0;
          std::__cxx11::string::operator=((string *)local_b0,(string *)&local_70);
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          if ((ulong *)s.field_2._8_8_ != &local_80) {
            operator_delete((void *)s.field_2._8_8_);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
        }
      }
      else {
        pcVar8 = "\\n";
        if (*(char *)((long)local_b0 + (long)pcVar12) == '\n') goto LAB_00133fb5;
      }
      if (local_50 != (undefined1  [8])psVar10) {
        operator_delete((void *)local_50);
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 < s._M_dataplus._M_p);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  plVar7 = (long *)std::__cxx11::string::append(local_50);
  psVar3 = local_d8;
  (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    lVar2 = plVar7[3];
    (local_d8->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_d8->field_2 + 8) = lVar2;
  }
  else {
    (local_d8->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_d8->field_2)._M_allocated_capacity = *psVar10;
  }
  local_d8->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_50 != (undefined1  [8])&subs._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_b0 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_b0);
  }
  return psVar3;
}

Assistant:

std::string toString(std::string const& value) {
		std::string s = value;
		if (getCurrentContext().getConfig()->showInvisibles()) {
			for (size_t i = 0; i < s.size(); ++i) {
				std::string subs;
				switch (s[i]) {
				case '\n': subs = "\\n"; break;
				case '\t': subs = "\\t"; break;
				default: break;
				}
				if (!subs.empty()) {
					s = s.substr(0, i) + subs + s.substr(i + 1);
					++i;
				}
			}
		}
		return "\"" + s + "\"";
	}